

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodInvocation.cpp
# Opt level: O1

void __thiscall
MethodInvocation::MethodInvocation
          (MethodInvocation *this,string *call_from,string *method_name,
          MethodExpression *arguments_list)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_Expression).super_Node._vptr_Node = (_func_int **)&PTR_Accept_0016d8f0;
  (this->super_Statement).super_Node._vptr_Node = (_func_int **)&PTR_Accept_0016d918;
  paVar1 = &(this->call_from_).field_2;
  (this->call_from_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (call_from->_M_dataplus)._M_p;
  paVar2 = &call_from->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&call_from->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->call_from_).field_2 + 8) = uVar4;
  }
  else {
    (this->call_from_)._M_dataplus._M_p = pcVar3;
    (this->call_from_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->call_from_)._M_string_length = call_from->_M_string_length;
  (call_from->_M_dataplus)._M_p = (pointer)paVar2;
  call_from->_M_string_length = 0;
  (call_from->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->method_name_).field_2;
  (this->method_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (method_name->_M_dataplus)._M_p;
  paVar2 = &method_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&method_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->method_name_).field_2 + 8) = uVar4;
  }
  else {
    (this->method_name_)._M_dataplus._M_p = pcVar3;
    (this->method_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->method_name_)._M_string_length = method_name->_M_string_length;
  (method_name->_M_dataplus)._M_p = (pointer)paVar2;
  method_name->_M_string_length = 0;
  (method_name->field_2)._M_local_buf[0] = '\0';
  this->arguments_list_ = arguments_list;
  return;
}

Assistant:

MethodInvocation::MethodInvocation(std::string call_from,
                                   std::string method_name,
                                   MethodExpression* arguments_list)
    : call_from_(std::move(call_from)),
      method_name_(std::move(method_name)),
      arguments_list_(arguments_list) {}